

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

BLOCK_SIZE
get_bsize(CommonModeInfoParams *mi_params,BLOCK_SIZE fp_block_size,int unit_row,int unit_col)

{
  uint8_t uVar1;
  bool bVar2;
  bool bVar3;
  int square_block_size;
  int max_dimension;
  int is_half_height;
  int is_half_width;
  int unit_height;
  int unit_width;
  int unit_col_local;
  int unit_row_local;
  BLOCK_SIZE fp_block_size_local;
  CommonModeInfoParams *mi_params_local;
  BLOCK_SIZE local_1;
  
  bVar2 = (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [fp_block_size] * unit_col +
               "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [fp_block_size] / 2) < mi_params->mi_cols;
  bVar3 = (int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [fp_block_size] * unit_row +
               "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [fp_block_size] / 2) < mi_params->mi_rows;
  if (block_size_high[fp_block_size] < block_size_wide[fp_block_size]) {
    uVar1 = block_size_wide[fp_block_size];
  }
  else {
    uVar1 = block_size_high[fp_block_size];
  }
  square_block_size = 0;
  if (uVar1 == '\x04') {
    square_block_size = 0;
  }
  else if (uVar1 == '\b') {
    square_block_size = 1;
  }
  else if (uVar1 == '\x10') {
    square_block_size = 2;
  }
  else if (uVar1 == ' ') {
    square_block_size = 3;
  }
  else if (uVar1 == '@') {
    square_block_size = 4;
  }
  else if (uVar1 == 0x80) {
    square_block_size = 5;
  }
  if ((bVar2) || (bVar3)) {
    if (bVar2) {
      local_1 = fp_block_size;
      if (!bVar3) {
        local_1 = subsize_lookup[1][square_block_size];
      }
    }
    else {
      local_1 = subsize_lookup[2][square_block_size];
    }
  }
  else {
    local_1 = subsize_lookup[3][square_block_size];
  }
  return local_1;
}

Assistant:

static BLOCK_SIZE get_bsize(const CommonModeInfoParams *const mi_params,
                            const BLOCK_SIZE fp_block_size, const int unit_row,
                            const int unit_col) {
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_height = mi_size_high[fp_block_size];
  const int is_half_width =
      unit_width * unit_col + unit_width / 2 >= mi_params->mi_cols;
  const int is_half_height =
      unit_height * unit_row + unit_height / 2 >= mi_params->mi_rows;
  const int max_dimension =
      AOMMAX(block_size_wide[fp_block_size], block_size_high[fp_block_size]);
  int square_block_size = 0;
  // 4X4, 8X8, 16X16, 32X32, 64X64, 128X128
  switch (max_dimension) {
    case 4: square_block_size = 0; break;
    case 8: square_block_size = 1; break;
    case 16: square_block_size = 2; break;
    case 32: square_block_size = 3; break;
    case 64: square_block_size = 4; break;
    case 128: square_block_size = 5; break;
    default: assert(0 && "First pass block size is not supported!"); break;
  }
  if (is_half_width && is_half_height) {
    return subsize_lookup[PARTITION_SPLIT][square_block_size];
  } else if (is_half_width) {
    return subsize_lookup[PARTITION_VERT][square_block_size];
  } else if (is_half_height) {
    return subsize_lookup[PARTITION_HORZ][square_block_size];
  } else {
    return fp_block_size;
  }
}